

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O2

void Js::InlineCache::VerifyRegistrationForInvalidation
               (InlineCache *cache,ScriptContext *scriptContext,PropertyId propertyId)

{
  byte bVar1;
  InlineCache **ppIVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined4 *puVar8;
  byte bVar9;
  bool bVar10;
  
  bVar10 = (~(cache->u).accessor.field_1.rawUInt16 & 0xb) == 0;
  bVar1 = *(byte *)&cache->u;
  bVar9 = bVar10 | bVar1;
  bVar4 = NeedsToBeRegisteredForStoreFieldInvalidation(cache);
  ppIVar2 = cache->invalidationListSlotPtr;
  if (ppIVar2 == (InlineCache **)0x0) {
    bVar5 = false;
    bVar6 = false;
  }
  else {
    bVar5 = ThreadContext::IsProtoInlineCacheRegistered
                      (scriptContext->threadContext,cache,propertyId);
    bVar6 = ThreadContext::IsStoreFieldInlineCacheRegistered
                      (scriptContext->threadContext,cache,propertyId);
  }
  if ((bVar4 & bVar9) == 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x238,"(howManyInvalidationsNeeded <= 1)",
                                "howManyInvalidationsNeeded <= 1");
    if (!bVar7) goto LAB_00894a3a;
    *puVar8 = 0;
  }
  if ((ppIVar2 == (InlineCache **)0x0) && (bVar4 || (bVar10 || (bVar1 & 1) != 0))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                 ,0x239,"((howManyInvalidationsNeeded == 0) || hasListSlotPtr)",
                                 "(howManyInvalidationsNeeded == 0) || hasListSlotPtr");
    if (!bVar10) goto LAB_00894a3a;
    *puVar8 = 0;
  }
  if ((~bVar9 & 1) == 0 && bVar5 == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                 ,0x23a,"(!needsProtoInvalidation || isProtoRegistered)",
                                 "!needsProtoInvalidation || isProtoRegistered");
    if (!bVar10) goto LAB_00894a3a;
    *puVar8 = 0;
  }
  if (bVar4 && bVar6 == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x23b,"(!needsStoreFieldInvalidation || isStoreFieldRegistered)",
                                "!needsStoreFieldInvalidation || isStoreFieldRegistered");
    if (!bVar4) goto LAB_00894a3a;
    *puVar8 = 0;
  }
  if ((ppIVar2 == (InlineCache **)0x0) || (bVar5 != false || bVar6 != false)) {
    if (ppIVar2 == (InlineCache **)0x0) {
      return;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x23c,"(!hasListSlotPtr || howManyRegistrations > 0)",
                                "!hasListSlotPtr || howManyRegistrations > 0");
    if (!bVar4) goto LAB_00894a3a;
    *puVar8 = 0;
  }
  if (*cache->invalidationListSlotPtr != cache) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x23d,
                                "(!hasListSlotPtr || (*cache->invalidationListSlotPtr) == cache)",
                                "!hasListSlotPtr || (*cache->invalidationListSlotPtr) == cache");
    if (!bVar4) {
LAB_00894a3a:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  return;
}

Assistant:

void InlineCache::VerifyRegistrationForInvalidation(const InlineCache* cache, ScriptContext* scriptContext, Js::PropertyId propertyId)
    {
        bool needsProtoInvalidation = cache->NeedsToBeRegisteredForProtoInvalidation();
        bool needsStoreFieldInvalidation = cache->NeedsToBeRegisteredForStoreFieldInvalidation();
        int howManyInvalidationsNeeded = (int)needsProtoInvalidation + (int)needsStoreFieldInvalidation;
        bool hasListSlotPtr = cache->invalidationListSlotPtr != nullptr;
        bool isProtoRegistered = hasListSlotPtr ? scriptContext->GetThreadContext()->IsProtoInlineCacheRegistered(cache, propertyId) : false;
        bool isStoreFieldRegistered = hasListSlotPtr ? scriptContext->GetThreadContext()->IsStoreFieldInlineCacheRegistered(cache, propertyId) : false;
        int howManyRegistrations = (int)isProtoRegistered + (int)isStoreFieldRegistered;

        Assert(howManyInvalidationsNeeded <= 1);
        Assert((howManyInvalidationsNeeded == 0) || hasListSlotPtr);
        Assert(!needsProtoInvalidation || isProtoRegistered);
        Assert(!needsStoreFieldInvalidation || isStoreFieldRegistered);
        Assert(!hasListSlotPtr || howManyRegistrations > 0);
        Assert(!hasListSlotPtr || (*cache->invalidationListSlotPtr) == cache);
    }